

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3b15::ProfileHandlerTest::StopWorker(ProfileHandlerTest *this)

{
  mutex *__mutex;
  BusyThread *pBVar1;
  
  pBVar1 = this->busy_worker_;
  __mutex = &pBVar1->mu_;
  std::mutex::lock(__mutex);
  pBVar1->stop_work_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_join((this->busy_worker_->super_Thread).thread_,(void **)0x0);
  if (this->busy_worker_ != (BusyThread *)0x0) {
    (*(this->busy_worker_->super_Thread)._vptr_Thread[1])();
    return;
  }
  return;
}

Assistant:

void StopWorker() {
    busy_worker_->set_stop_work(true);
    busy_worker_->Join();
    delete busy_worker_;
  }